

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::resolve(Path *this,Value *root,Value *defaultValue)

{
  bool bVar1;
  const_iterator this_00;
  reference key;
  Value *in_RDX;
  Value *in_RDI;
  PathArgument *arg;
  const_iterator it;
  Value *node;
  ArrayIndex in_stack_000001a4;
  Value *in_stack_000001a8;
  Value *this_01;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_30;
  Value *local_28;
  
  this_01 = in_RDI;
  local_28 = in_RDX;
  local_30._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin
                 ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
  do {
    this_00 = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end
                        ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)this_01,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_RDI);
    if (!bVar1) {
      Value::Value(node,(Value *)it._M_current);
      return this_01;
    }
    key = __gnu_cxx::
          __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
          ::operator*(&local_30);
    if (key->kind_ == kindIndex) {
      bVar1 = Value::isArray(local_28);
      if ((!bVar1) ||
         (bVar1 = Value::isValidIndex(this_01,(ArrayIndex)((ulong)in_RDI >> 0x20)), !bVar1)) {
        Value::Value(node,(Value *)it._M_current);
        return this_01;
      }
      local_28 = Value::operator[](in_stack_000001a8,in_stack_000001a4);
    }
    else if (key->kind_ == kindKey) {
      bVar1 = Value::isObject(local_28);
      if (!bVar1) {
        Value::Value(node,(Value *)it._M_current);
        return this_01;
      }
      local_28 = Value::operator[]((Value *)this_00._M_current,&key->key_);
      if (local_28 == (Value *)kNull) {
        Value::Value(node,(Value *)it._M_current);
        return this_01;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullRef)
        return defaultValue;
    }
  }
  return *node;
}